

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O1

bool nv::ImageIO::save(char *fileName,Image *img)

{
  bool bVar1;
  int iVar2;
  StdOutputStream stream;
  StdOutputStream local_38;
  
  StdOutputStream::StdOutputStream(&local_38,fileName);
  if ((FILE *)local_38.super_StdStream.m_fp != (FILE *)0x0) {
    iVar2 = ferror((FILE *)local_38.super_StdStream.m_fp);
    if (iVar2 == 0) {
      bVar1 = save(fileName,(Stream *)&local_38,img);
      goto LAB_001c3911;
    }
  }
  bVar1 = false;
LAB_001c3911:
  local_38.super_StdStream.super_Stream._vptr_Stream = (_func_int **)&PTR__StdStream_0024d6e8;
  if (((FILE *)local_38.super_StdStream.m_fp != (FILE *)0x0) &&
     (local_38.super_StdStream.m_autoclose == true)) {
    fclose((FILE *)local_38.super_StdStream.m_fp);
  }
  return bVar1;
}

Assistant:

bool nv::ImageIO::save(const char * fileName, Image * img)
{
	nvDebugCheck(fileName != NULL);
	nvDebugCheck(img != NULL);

	StdOutputStream stream(fileName);
	if (stream.isError())
	{
		return false;
	}

	return ImageIO::save(fileName, stream, img);
}